

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTriangleMeshConnected.cpp
# Opt level: O1

bool __thiscall
chrono::geometry::ChTriangleMeshConnected::SplitEdge
          (ChTriangleMeshConnected *this,int itA,int itB,int neA,int neB,int *itA_1,int *itA_2,
          int *itB_1,int *itB_2,
          vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *tri_map,
          vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
          *aux_data_double,
          vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
          *aux_data_int,
          vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
          *aux_data_bool,
          vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
          *aux_data_vect)

{
  pointer *ppaVar1;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *pvVar2;
  undefined4 uVar3;
  pointer paVar4;
  iterator iVar5;
  pointer paVar6;
  vector<double,std::allocator<double>> *this_00;
  iterator __position;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *this_01;
  pointer pCVar7;
  vector<int,std::allocator<int>> *this_02;
  iterator __position_00;
  undefined8 *puVar8;
  vector<bool,_std::allocator<bool>_> *this_03;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ChGeometry CVar13;
  undefined8 uVar14;
  undefined1 extraout_AL;
  undefined1 uVar15;
  undefined1 extraout_AL_00;
  undefined1 extraout_AL_01;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  pair<int,_int> pVar20;
  pair<int,_int> pVar21;
  int *piVar22;
  list<int,std::allocator<int>> *plVar23;
  pointer pCVar24;
  long lVar25;
  vector<int,_std::allocator<int>_> *pvVar26;
  ChException *this_04;
  uint uVar27;
  undefined4 in_register_0000000c;
  ChTriangleMeshConnected *pCVar28;
  pointer pCVar29;
  long lVar30;
  ChTriangleMeshConnected *pCVar31;
  ChTriangleMeshConnected *extraout_RDX;
  uint uVar32;
  ChTriangleMeshConnected *__n;
  pair<int,_int> unaff_RBP;
  pair<int,_int> pVar33;
  int iVar34;
  ChTriangleMeshConnected *pCVar35;
  char *this_05;
  undefined4 in_register_00000084;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *created_index;
  ulong uVar36;
  ChTriangleMeshConnected *pCVar37;
  pair<int,_int> pVar38;
  undefined8 *puVar39;
  pair<int,_int> pVar40;
  ChTriangleMeshConnected *this_06;
  uint uVar41;
  pair<int,_int> __args;
  bool __x;
  double dVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  reference rVar49;
  int iVnew;
  array<int,_4UL> topo_A_2;
  array<int,_4UL> topo_B_2;
  array<int,_4UL> topo_B_1;
  array<std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>_*,_4UL>
  face_indexes;
  int iStack_288;
  int iStack_284;
  vector<int,_std::allocator<int>_> vStack_280;
  int iStack_264;
  int iStack_260;
  int iStack_25c;
  double dStack_258;
  undefined1 auStack_250 [32];
  vector<bool,_std::allocator<bool>_> vStack_230;
  pointer pCStack_208;
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> vStack_200;
  pointer pCStack_1e8;
  list<int,std::allocator<int>> *aplStack_1e0 [3];
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *pvStack_1c8;
  vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
  *pvStack_1c0;
  pointer pCStack_1b8;
  pointer pCStack_1b0;
  ChTriangleMeshConnected *pCStack_1a8;
  list<int,std::allocator<int>> *plStack_1a0;
  string sStack_198;
  ChTriangleMeshConnected *pCStack_178;
  pair<int,_int> pStack_170;
  pair<int,_int> pStack_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_160;
  pair<int,_int> pStack_150;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  value_type local_138;
  ChTriangleMeshConnected *local_120;
  ChTriangleMeshConnected *local_118;
  value_type local_10c;
  vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
  *local_100;
  pair<int,_int> local_f8;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  uint local_dc;
  array<int,_4UL> local_d8;
  array<int,_4UL> local_c8;
  ChTriangleMeshConnected *local_b0;
  pointer local_a8;
  pointer pCStack_a0;
  long local_90;
  long local_88;
  vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
  *local_80;
  undefined8 local_78;
  ulong local_70;
  pair<int,_int> local_68;
  pair<int,_int> local_60;
  pair<int,_int> local_58;
  vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *local_50 [4];
  
  created_index =
       (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
        *)CONCAT44(in_register_00000084,neB);
  local_100 = (vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
               *)itA_1;
  __n = (ChTriangleMeshConnected *)(ulong)(uint)itB;
  pVar38.second = 0;
  pVar38.first = itA;
  local_50[0] = &this->m_face_v_indices;
  local_50[1] = &this->m_face_n_indices;
  local_50[2] = &this->m_face_uv_indices;
  local_b0 = this;
  local_50[3] = &this->m_face_col_indices;
  local_e0 = neA + 3 + ((neA + 2) / 3) * -3;
  local_88 = (long)(neA + 1);
  local_78 = CONCAT44(in_register_0000000c,neA);
  local_e4 = neA + 2 + ((neA + 1) / 3) * -3;
  iVar16 = neB + 1;
  local_e8 = neB + 3 + ((neB + 2) / 3) * -3;
  local_90 = (long)iVar16;
  pCVar28 = (ChTriangleMeshConnected *)((ulong)((long)iVar16 * 0x55555556) >> 0x3f);
  local_80 = created_index;
  local_ec = neB + 2 + (iVar16 / 3) * -3;
  pCVar37 = (ChTriangleMeshConnected *)(long)itA;
  local_118 = (ChTriangleMeshConnected *)(long)itB;
  pVar20.first = 0;
  pVar20.second = 0;
  local_144 = 0;
  local_140 = 0;
  local_120 = pCVar37;
  local_13c = itB;
  local_dc = itA;
  do {
    pVar40.first = -0x55555555;
    pVar40.second = -0x55555556;
    this_06 = (ChTriangleMeshConnected *)local_50[(long)pVar20];
    pCVar24 = (((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
               &this_06->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start;
    lVar30 = (long)(this_06->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start - (long)pCVar24;
    if (lVar30 == 0) {
      local_138.m_data[0] = (double)CONCAT44(local_138.m_data[0]._4_4_,0xffffffff);
      pCVar28 = (ChTriangleMeshConnected *)(ulong)local_140;
      created_index =
           (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            *)&local_138;
      pStack_150.first = 0x828c66;
      pStack_150.second = 0;
      this = local_b0;
      InterpolateAndInsert(local_b0,pVar20.first,local_144,local_140,(int *)created_index);
      pCVar37 = local_120;
    }
    else {
      pCVar31 = (ChTriangleMeshConnected *)((lVar30 >> 2) * -0x5555555555555555);
      pCVar35 = pCVar37;
      __args = pVar20;
      if (pCVar31 < pCVar37 || (long)pCVar31 - (long)pCVar37 == 0) goto LAB_00829110;
      pVar40 = (pair<int,_int>)((long)pCVar37 * 3);
      __args.first = 0;
      __args.second = 0;
      pStack_150.first = 0x828928;
      pStack_150.second = 0;
      local_f8 = pVar20;
      unaff_RBP = GetTriangleEdgeIndexes(this,pCVar24 + (long)pCVar37,(int)local_78,false);
      uVar19 = 0;
      pVar20 = __args;
      if ((int)__n != -1) {
        pCVar24 = (((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                   &this_06->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start;
        pCVar28 = (ChTriangleMeshConnected *)0xaaaaaaaaaaaaaaab;
        pCVar31 = (ChTriangleMeshConnected *)
                  (((long)(this_06->m_vertices).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)pCVar24 >> 2) *
                  -0x5555555555555555);
        pCVar35 = local_118;
        if (pCVar31 < local_118 || (long)pCVar31 - (long)local_118 == 0) goto LAB_00829110;
        pStack_150.first = 0x828976;
        pStack_150.second = 0;
        pVar20 = GetTriangleEdgeIndexes(this,pCVar24 + (long)local_118,(int)local_80,false);
        uVar19 = (ulong)pVar20 >> 0x20;
      }
      pVar38 = local_f8;
      local_60 = (pair<int,_int>)((ulong)unaff_RBP >> 0x20);
      __args = (pair<int,_int>)((ulong)unaff_RBP & 0xffffffff);
      pVar21 = local_60;
      if (unaff_RBP.second < unaff_RBP.first) {
        __args.second = 0;
        __args.first = unaff_RBP.second;
        pVar21 = unaff_RBP;
      }
      __n = (ChTriangleMeshConnected *)((ulong)pVar21 & 0xffffffff);
      pVar33.first = -1;
      pVar33.second = 0;
      local_148 = 0xffffffff;
      uVar41 = __args.first;
      uVar32 = pVar21.first;
      pStack_150.first = 0x8289d7;
      pStack_150.second = 0;
      pCVar28 = __n;
      local_70 = uVar19;
      local_68 = pVar20;
      local_58 = unaff_RBP;
      InterpolateAndInsert(local_b0,local_f8.first,uVar41,uVar32,(int *)&local_148);
      pVar21 = local_58;
      uVar27 = local_dc;
      if (pVar38 == (pair<int,_int>)0x0) {
        local_144 = uVar41;
        local_140 = uVar32;
      }
      *(uint *)local_100 = 0xffffffff;
      *itA_2 = -1;
      *itB_1 = -1;
      *itB_2 = -1;
      pCVar24 = (((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                 &this_06->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start;
      created_index =
           (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            *)0xaaaaaaaaaaaaaaab;
      pCVar31 = (ChTriangleMeshConnected *)
                (((long)(this_06->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)pCVar24 >> 2) *
                -0x5555555555555555);
      unaff_RBP = pVar33;
      pCVar35 = local_120;
      if (pCVar31 < local_120 || (long)pCVar31 - (long)local_120 == 0) goto LAB_00829110;
      uVar9 = pCVar24[(long)pCVar37].m_data[0];
      if (pCVar24[(long)pCVar37].m_data[0] == uVar41) {
        uVar9 = local_148;
      }
      uVar10 = pCVar24[(long)pCVar37].m_data[1];
      if (pCVar24[(long)pCVar37].m_data[1] == uVar41) {
        uVar10 = local_148;
      }
      pCVar28 = (ChTriangleMeshConnected *)(ulong)uVar10;
      uVar11 = pCVar24[(long)pCVar37].m_data[2];
      if (pCVar24[(long)pCVar37].m_data[2] == uVar41) {
        uVar11 = local_148;
      }
      pCVar24 = (((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                 &this_06->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start;
      pCVar31 = (ChTriangleMeshConnected *)
                (((long)(this_06->m_vertices).
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start - (long)pCVar24 >> 2) *
                -0x5555555555555555);
      pVar38.second = 0;
      pVar38.first = local_dc;
      pCVar35 = local_120;
      if (pCVar31 < local_120 || (long)pCVar31 - (long)local_120 == 0) goto LAB_00829110;
      local_10c.m_data[2] = pCVar24[(long)pCVar37].m_data[2];
      local_10c.m_data[0] = pCVar24[(long)pCVar37].m_data[0];
      if (pCVar24[(long)pCVar37].m_data[0] == uVar32) {
        local_10c.m_data[0] = local_148;
      }
      itA_1 = (int *)(ulong)(uint)local_10c.m_data[0];
      local_10c.m_data[1] = pCVar24[(long)pCVar37].m_data[1];
      if (pCVar24[(long)pCVar37].m_data[1] == uVar32) {
        local_10c.m_data[1] = local_148;
      }
      created_index =
           (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
            *)(ulong)(uint)local_10c.m_data[1];
      if (local_10c.m_data[2] == uVar32) {
        local_10c.m_data[2] = local_148;
      }
      pCVar24 = pCVar24 + (long)pCVar37;
      pCVar24->m_data[0] = uVar9;
      pCVar24->m_data[1] = uVar10;
      pCVar24->m_data[2] = uVar11;
      *(uint *)local_100 = local_dc;
      pStack_150.first = 0x828aed;
      pStack_150.second = 0;
      this = this_06;
      std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)this_06,
                 &local_10c);
      *itA_2 = (int)((ulong)((long)(this_06->m_vertices).
                                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start -
                            (long)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                     *)&this_06->super_ChTriangleMesh)->_M_impl).
                                  super__Vector_impl_data._M_start) >> 2) * -0x55555555 + -1;
      pVar40.first = -0x55555555;
      pVar40.second = -0x55555556;
      unaff_RBP = pVar21;
      if (local_13c != 0xffffffff) {
        created_index =
             (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              *)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                 &this_06->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start;
        pCVar37 = (ChTriangleMeshConnected *)
                  (((long)(this_06->m_vertices).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)created_index >> 2) *
                  -0x5555555555555555);
        pCVar35 = local_118;
        if (pCVar37 < local_118 || (long)pCVar37 - (long)local_118 == 0) goto LAB_00829110;
        uVar9 = *(uint *)(created_index + (long)local_118 * 0xc);
        if (*(uint *)(created_index + (long)local_118 * 0xc) == uVar41) {
          uVar9 = local_148;
        }
        uVar10 = *(uint *)(created_index + (long)local_118 * 0xc + 4);
        if (*(uint *)(created_index + (long)local_118 * 0xc + 4) == uVar41) {
          uVar10 = local_148;
        }
        pCVar28 = (ChTriangleMeshConnected *)(ulong)uVar10;
        uVar11 = *(uint *)(created_index + (long)local_118 * 0xc + 8);
        if (*(uint *)(created_index + (long)local_118 * 0xc + 8) == uVar41) {
          uVar11 = local_148;
        }
        created_index =
             (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              *)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
                 &this_06->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start;
        pCVar37 = (ChTriangleMeshConnected *)
                  (((long)(this_06->m_vertices).
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start - (long)created_index >> 2) *
                  -0x5555555555555555);
        if (pCVar37 < local_118 || (long)pCVar37 - (long)local_118 == 0) goto LAB_00829110;
        uVar41 = *(uint *)(created_index + (long)local_118 * 0xc);
        if (*(uint *)(created_index + (long)local_118 * 0xc) == uVar32) {
          uVar41 = local_148;
        }
        uVar12 = *(uint *)(created_index + (long)local_118 * 0xc + 4);
        if (*(uint *)(created_index + (long)local_118 * 0xc + 4) == uVar32) {
          uVar12 = local_148;
        }
        local_138.m_data[0] = (double)CONCAT44(uVar12,uVar41);
        uVar41 = *(uint *)(created_index + (long)local_118 * 0xc + 8);
        if (*(uint *)(created_index + (long)local_118 * 0xc + 8) == uVar32) {
          uVar41 = local_148;
        }
        local_138.m_data[1] = (double)CONCAT44(local_138.m_data[1]._4_4_,uVar41);
        pvVar2 = created_index + (long)local_118 * 0xc;
        *(uint *)pvVar2 = uVar9;
        *(uint *)(pvVar2 + 4) = uVar10;
        *(uint *)(pvVar2 + 8) = uVar11;
        *itB_1 = local_13c;
        pStack_150.first = 0x828bf6;
        pStack_150.second = 0;
        pCVar28 = (ChTriangleMeshConnected *)itB_1;
        this = this_06;
        std::vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>::push_back
                  ((vector<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)this_06
                   ,(value_type *)&local_138);
        *itB_2 = (int)((ulong)((long)(this_06->m_vertices).
                                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start -
                              (long)(((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                       *)&this_06->super_ChTriangleMesh)->_M_impl).
                                    super__Vector_impl_data._M_start) >> 2) * -0x55555555 + -1;
      }
      lVar30 = local_88;
      itA_1 = (int *)local_100;
      pCVar37 = local_120;
      uVar32 = local_13c;
      __n = (ChTriangleMeshConnected *)(ulong)local_13c;
      pVar20 = local_f8;
      if (local_f8 == (pair<int,_int>)0x0) {
        paVar4 = (tri_map->
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        paVar6 = paVar4 + (long)local_120;
        iVar18 = local_60.first;
        local_138.m_data[0] =
             (double)*(vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                       **)paVar4[(long)local_120]._M_elems;
        local_138.m_data[1] = *(double *)(paVar4[(long)local_120]._M_elems + 2);
        local_d8._M_elems._0_8_ = *(undefined8 *)paVar4[(long)local_120]._M_elems;
        local_d8._M_elems._8_8_ = *(undefined8 *)(paVar4[(long)local_120]._M_elems + 2);
        *(int *)((long)local_138.m_data + local_88 * 4) = *itB_1;
        local_d8._M_elems[lVar30] = *itB_2;
        iVar16 = local_e0;
        iVar17 = local_e4;
        if (iVar18 < pVar21.first) {
          iVar16 = local_e4;
          iVar17 = local_e0;
        }
        created_index =
             (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
              *)(long)iVar16;
        *(int *)((long)local_138.m_data + (long)created_index * 4) = *itA_2;
        local_d8._M_elems[iVar17] = *itA_1;
        iVar16 = *(int *)((long)local_138.m_data + (long)iVar17 * 4);
        iVar17 = local_d8._M_elems[(long)created_index];
        lVar30 = 1;
        do {
          if (paVar4[iVar16]._M_elems[lVar30] == uVar27) {
            created_index =
                 (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                  *)(ulong)(uint)*itA_1;
            paVar4[iVar16]._M_elems[lVar30] = *itA_1;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        lVar30 = 1;
        do {
          if (paVar4[iVar17]._M_elems[lVar30] == uVar27) {
            paVar4[iVar17]._M_elems[lVar30] = *itA_2;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 4);
        *(double *)paVar6->_M_elems = local_138.m_data[0];
        *(double *)(paVar6->_M_elems + 2) = local_138.m_data[1];
        iVar5._M_current =
             (tri_map->
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (tri_map->
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          pStack_150.first = 0x828d6a;
          pStack_150.second = 0;
          this = (ChTriangleMeshConnected *)tri_map;
          std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
          _M_realloc_insert<std::array<int,4ul>const&>
                    ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)tri_map,
                     iVar5,&local_d8);
          itA_1 = (int *)local_100;
          pCVar37 = local_120;
        }
        else {
          *(undefined8 *)(iVar5._M_current)->_M_elems = local_d8._M_elems._0_8_;
          *(undefined8 *)((iVar5._M_current)->_M_elems + 2) = local_d8._M_elems._8_8_;
          ppaVar1 = &(tri_map->
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppaVar1 = *ppaVar1 + 1;
          this = (ChTriangleMeshConnected *)0x4;
        }
        lVar30 = local_90;
        paVar6 = (tri_map->
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar27 = (int)((ulong)((long)(tri_map->
                                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish - (long)paVar6) >>
                      4) - 1;
        pCVar28 = (ChTriangleMeshConnected *)(ulong)uVar27;
        local_d8._M_elems[0] = uVar27;
        unaff_RBP = (pair<int,_int>)itB_1;
        pVar20 = local_f8;
        if (uVar32 != 0xffffffff) {
          pCVar28 = (ChTriangleMeshConnected *)(paVar6 + (long)local_118);
          iVar18 = local_68.first;
          iVar34 = (int)local_70;
          local_a8 = *(pointer *)paVar6[(long)local_118]._M_elems;
          pCStack_a0 = *(pointer *)(paVar6[(long)local_118]._M_elems + 2);
          local_c8._M_elems._0_8_ = *(undefined8 *)paVar6[(long)local_118]._M_elems;
          local_c8._M_elems._8_8_ = *(undefined8 *)(paVar6[(long)local_118]._M_elems + 2);
          *(int *)((long)&local_a8 + local_90 * 4) = *itA_1;
          local_c8._M_elems[lVar30] = *itA_2;
          iVar16 = local_e8;
          iVar17 = local_ec;
          if (iVar34 < iVar18) {
            iVar16 = local_ec;
            iVar17 = local_e8;
          }
          created_index =
               (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                *)(long)iVar16;
          *(int *)((long)&local_a8 + (long)created_index * 4) = *itB_2;
          local_c8._M_elems[iVar17] = *itB_1;
          iVar16 = *(int *)((long)&local_a8 + (long)iVar17 * 4);
          iVar17 = local_c8._M_elems[(long)created_index];
          lVar30 = 1;
          do {
            if (paVar6[iVar16]._M_elems[lVar30] == uVar32) {
              created_index =
                   (vector<std::vector<double,_std::allocator<double>_>_*,_std::allocator<std::vector<double,_std::allocator<double>_>_*>_>
                    *)(ulong)(uint)*itB_1;
              paVar6[iVar16]._M_elems[lVar30] = *itB_1;
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != 4);
          lVar30 = 1;
          do {
            if (paVar6[iVar17]._M_elems[lVar30] == uVar32) {
              paVar6[iVar17]._M_elems[lVar30] = *itB_2;
            }
            lVar30 = lVar30 + 1;
          } while (lVar30 != 4);
          (((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *)
           &pCVar28->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start = local_a8;
          (pCVar28->m_vertices).
          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
          _M_impl.super__Vector_impl_data._M_start = pCStack_a0;
          iVar5._M_current =
               (tri_map->
               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (tri_map->
              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            pStack_150.first = 0x828ea8;
            pStack_150.second = 0;
            this = (ChTriangleMeshConnected *)tri_map;
            std::vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>>::
            _M_realloc_insert<std::array<int,4ul>const&>
                      ((vector<std::array<int,4ul>,std::allocator<std::array<int,4ul>>> *)tri_map,
                       iVar5,&local_c8);
            pCVar37 = local_120;
            pVar20 = local_f8;
          }
          else {
            *(undefined8 *)(iVar5._M_current)->_M_elems = local_c8._M_elems._0_8_;
            *(undefined8 *)((iVar5._M_current)->_M_elems + 2) = local_c8._M_elems._8_8_;
            ppaVar1 = &(tri_map->
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar1 = *ppaVar1 + 1;
            this = (ChTriangleMeshConnected *)0x4;
          }
        }
      }
    }
    pVar20 = (pair<int,_int>)((long)pVar20 + 1);
  } while (pVar20 != (pair<int,_int>)0x4);
  pVar38 = *(pair<int,_int> *)aux_data_double;
  pVar40 = *(pair<int,_int> *)(aux_data_double + 8);
  __n = (ChTriangleMeshConnected *)(long)(int)local_144;
  this_06 = (ChTriangleMeshConnected *)(long)(int)local_140;
  if (pVar38 != pVar40) {
    __args = (pair<int,_int>)&local_138;
    do {
      this_00 = *(vector<double,std::allocator<double>> **)pVar38;
      lVar30 = *(long *)this_00;
      __position._M_current = *(double **)(this_00 + 8);
      pCVar37 = (ChTriangleMeshConnected *)((long)__position._M_current - lVar30 >> 3);
      pCVar35 = __n;
      if ((pCVar37 <= __n) || (pCVar35 = this_06, pCVar37 <= this_06)) goto LAB_00829110;
      local_138.m_data[0] =
           (*(double *)(lVar30 + (long)__n * 8) + *(double *)(lVar30 + (long)this_06 * 8)) * 0.5;
      if (__position._M_current == *(double **)(this_00 + 0x10)) {
        pStack_150.first = 0x828f35;
        pStack_150.second = 0;
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (this_00,__position,(double *)__args);
      }
      else {
        *__position._M_current = local_138.m_data[0];
        *(double **)(this_00 + 8) = __position._M_current + 1;
      }
      pVar38 = (pair<int,_int>)((long)pVar38 + 8);
    } while (pVar38 != pVar40);
  }
  pVar38 = *(pair<int,_int> *)aux_data_vect;
  pVar40 = *(pair<int,_int> *)(aux_data_vect + 8);
  if (pVar38 != pVar40) {
    unaff_RBP = (pair<int,_int>)((long)__n * 3);
    __args = (pair<int,_int>)((long)this_06 * 3);
    do {
      this_01 = *(vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> **)
                 pVar38;
      pCVar7 = (this_01->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pCVar28 = (ChTriangleMeshConnected *)0xaaaaaaaaaaaaaaab;
      pCVar37 = (ChTriangleMeshConnected *)
                (((long)(this_01->
                        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar7 >> 3) *
                -0x5555555555555555);
      pCVar35 = __n;
      if ((pCVar37 < __n || (long)pCVar37 - (long)__n == 0) ||
         (pCVar35 = this_06, pCVar37 < this_06 || (long)pCVar37 - (long)this_06 == 0))
      goto LAB_00829110;
      local_138.m_data[0] = (pCVar7[(long)__n].m_data[0] + pCVar7[(long)this_06].m_data[0]) * 0.5;
      local_138.m_data[1] = (pCVar7[(long)__n].m_data[1] + pCVar7[(long)this_06].m_data[1]) * 0.5;
      local_138.m_data[2] = (pCVar7[(long)__n].m_data[2] + pCVar7[(long)this_06].m_data[2]) * 0.5;
      pStack_150.first = 0x828ff7;
      pStack_150.second = 0;
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                (this_01,&local_138);
      pVar38 = (pair<int,_int>)((long)pVar38 + 8);
    } while (pVar38 != pVar40);
  }
  pVar38 = *(pair<int,_int> *)aux_data_int;
  pVar40 = *(pair<int,_int> *)(aux_data_int + 8);
  if (pVar38 != pVar40) {
    __args = (pair<int,_int>)&local_138;
    do {
      this_02 = *(vector<int,std::allocator<int>> **)pVar38;
      lVar30 = *(long *)this_02;
      __position_00._M_current = *(int **)(this_02 + 8);
      pCVar37 = (ChTriangleMeshConnected *)((long)__position_00._M_current - lVar30 >> 2);
      pCVar35 = __n;
      if ((pCVar37 <= __n) || (pCVar35 = this_06, pCVar37 <= this_06)) {
LAB_00829110:
        this_05 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        pStack_150.first = 0x829117;
        pStack_150.second = 0;
        pCStack_208 = (pointer)std::__throw_out_of_range_fmt
                                         (
                                         "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                         );
        pvStack_1c8 = created_index;
        pvStack_1c0 = (vector<std::vector<int,_std::allocator<int>_>_*,_std::allocator<std::vector<int,_std::allocator<int>_>_*>_>
                       *)itA_1;
        pCStack_178 = __n;
        pStack_170 = pVar38;
        pStack_168 = pVar40;
        aStack_160._M_allocated_capacity = (size_type)this_06;
        aStack_160._8_8_ = __args;
        pStack_150 = unaff_RBP;
        std::__cxx11::list<int,std::allocator<int>>::
        list<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                  ((list<int,std::allocator<int>> *)aplStack_1e0,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_> *
                     )&pCVar35->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data._M_start,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   (pCVar35->m_vertices).
                   super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(allocator_type *)&vStack_230);
        vStack_200.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_200.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_200.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pCVar28 == (ChTriangleMeshConnected *)0x0) {
          ComputeNeighbouringTriangleMap((ChTriangleMeshConnected *)this_05,&vStack_200);
        }
        else {
          std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::operator=
                    (&vStack_200,
                     (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)pCVar28
                    );
        }
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
        std::vector<bool,_std::allocator<bool>_>::resize
                  (&vStack_230,
                   ((long)(((ChTriangleMeshConnected *)this_05)->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(((ChTriangleMeshConnected *)this_05)->m_face_v_indices).
                          super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
                   false);
        pCVar7 = (pCVar35->m_vertices).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (piVar22 = ((((_Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                           *)&pCVar35->super_ChTriangleMesh)->_M_impl).super__Vector_impl_data.
                       _M_start)->m_data; (pointer)piVar22 != pCVar7; piVar22 = piVar22 + 1) {
          uVar36 = (ulong)*piVar22;
          uVar19 = uVar36 + 0x3f;
          if (-1 < (long)uVar36) {
            uVar19 = uVar36;
          }
          ((double *)
          vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p)
          [((long)uVar19 >> 6) + ((ulong)((uVar36 & 0x800000000000003f) < 0x8000000000000001) - 1)]
               = (double)((ulong)((double *)
                                 vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                                 [((long)uVar19 >> 6) +
                                  ((ulong)((uVar36 & 0x800000000000003f) < 0x8000000000000001) - 1)]
                         | 1L << (uVar36 & 0x3f));
        }
        vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        plVar23 = aplStack_1e0[0];
        pCStack_1a8 = pCVar35;
        if (aplStack_1e0[0] != (list<int,std::allocator<int>> *)aplStack_1e0) {
          do {
            uVar3 = *(undefined4 *)(plVar23 + 0x10);
            auStack_250._16_8_ = (pointer)0x0;
            auStack_250._0_8_ = auStack_250;
            auStack_250._8_8_ = auStack_250;
            plStack_1a0 = plVar23;
            pCVar28 = (ChTriangleMeshConnected *)::operator_new(0x18);
            *(undefined4 *)
             &(pCVar28->m_vertices).
              super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = uVar3;
            std::__detail::_List_node_base::_M_hook((_List_node_base *)pCVar28);
            auStack_250._16_8_ = (long)(double *)auStack_250._16_8_ + 1;
            if ((undefined1 *)auStack_250._0_8_ != auStack_250) {
              do {
                pCVar24 = (pointer)(long)*(int *)&(((
                                                  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                                  *)(auStack_250._8_8_ + 8))->
                                                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish;
                lVar30 = 0;
                dStack_258 = 0.0;
                iStack_264 = 0;
                iVar16 = 0;
                pCStack_1b8 = pCVar24;
                do {
                  pVar38 = GetTriangleEdgeIndexes
                                     (pCVar28,(((ChTriangleMeshConnected *)this_05)->
                                              m_face_v_indices).
                                              super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start +
                                              (long)pCVar24,(int)lVar30,true);
                  iVar17 = pVar38.first;
                  if (extraout_RDX == (ChTriangleMeshConnected *)0x0) {
                    lVar25 = (long)pVar38 >> 0x20;
                    pCVar7 = (((ChTriangleMeshConnected *)this_05)->m_vertices).
                             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    dVar42 = pCVar7[iVar17].m_data[1] - pCVar7[lVar25].m_data[1];
                    auVar43._8_8_ = 0;
                    auVar43._0_8_ = dVar42 * dVar42;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = pCVar7[iVar17].m_data[0] - pCVar7[lVar25].m_data[0];
                    auVar43 = vfmadd231sd_fma(auVar43,auVar47,auVar47);
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = pCVar7[iVar17].m_data[2] - pCVar7[lVar25].m_data[2];
                    auVar43 = vfmadd231sd_fma(auVar43,auVar45,auVar45);
                    if (auVar43._0_8_ < 0.0) {
                      dVar42 = sqrt(auVar43._0_8_);
                    }
                    else {
                      auVar43 = vsqrtsd_avx(auVar43,auVar43);
                      dVar42 = auVar43._0_8_;
                    }
                  }
                  else {
                    pCVar28 = extraout_RDX;
                    dVar42 = (double)(*(code *)((_List_node_base *)
                                               (extraout_RDX->super_ChTriangleMesh).super_ChGeometry
                                               ._vptr_ChGeometry)[1]._M_next)
                                               (extraout_RDX,(ulong)pVar38 & 0xffffffff,
                                                (ulong)pVar38 >> 0x20,this_05);
                  }
                  if (dStack_258 < dVar42) {
                    iVar16 = *(int *)((long)(vStack_200.
                                             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                     lVar30 * 4 + ((long)pCVar24 << 4 | 4U));
                    iStack_264 = (int)lVar30;
                    dStack_258 = dVar42;
                  }
                  lVar30 = lVar30 + 1;
                } while (lVar30 != 3);
                if (dStack_258 < (double)pCStack_208) {
LAB_0082983f:
                  pCVar28 = (ChTriangleMeshConnected *)auStack_250._8_8_;
                  auStack_250._16_8_ = (long)((pointer)(auStack_250._16_8_ + -0x18))->m_data + 0x17;
                  std::__detail::_List_node_base::_M_unhook();
                  operator_delete(pCVar28,0x18);
                }
                else {
                  pCVar28 = (ChTriangleMeshConnected *)::operator_new(0x18);
                  *(int *)&(pCVar28->m_vertices).
                           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish = iVar16;
                  std::__detail::_List_node_base::_M_hook((_List_node_base *)pCVar28);
                  pCVar24 = pCStack_1b8;
                  auStack_250._16_8_ = (long)(double *)auStack_250._16_8_ + 1;
                  if ((pointer)0x3e8 < (ulong)auStack_250._16_8_) {
                    this_04 = (ChException *)__cxa_allocate_exception(0x28);
                    sStack_198._M_dataplus._M_p = (pointer)&sStack_198.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&sStack_198,
                               "overflow in ChTriangleMeshConnected::RefineMeshEdges","");
                    ChException::ChException(this_04,&sStack_198);
                    __cxa_throw(this_04,&ChException::typeinfo,ChException::~ChException);
                  }
                  if (iVar16 == -1) {
                    if (((double)pCStack_208 < dStack_258) &&
                       (SplitEdge((ChTriangleMeshConnected *)this_05,(int)pCStack_1b8,-1,iStack_264,
                                  0,&iStack_284,&iStack_288,&iStack_25c,&iStack_260,&vStack_200,
                                  pvStack_1c8,pvStack_1c0,
                                  (vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
                                   *)CONCAT44(local_13c,local_140),
                                  (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                                   *)local_138.m_data[0]),
                       pCVar24 < (pointer)((ulong)vStack_230.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                          ((long)vStack_230.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_finish.
                                                 super__Bit_iterator_base._M_p -
                                          (long)vStack_230.
                                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                super__Bvector_impl_data._M_start.
                                                super__Bit_iterator_base._M_p) * 8))) {
                      pCVar29 = (pointer)((long)pCVar24[5].m_data + 3);
                      if (-1 < (long)pCVar24) {
                        pCVar29 = pCVar24;
                      }
                      if (((ulong)((double *)
                                  vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                                  [((long)pCVar29 >> 6) +
                                   ((ulong)(((ulong)pCVar24 & 0x800000000000003f) <
                                           0x8000000000000001) - 1)] >> ((ulong)pCVar24 & 0x3f) & 1)
                          != 0) {
                        if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    ((vector<int,std::allocator<int>> *)&vStack_280,
                                     (iterator)
                                     vStack_280.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,&iStack_284);
                        }
                        else {
                          *vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = iStack_284;
                          vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 1;
                        }
                        iVar16 = iStack_288;
                        if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish ==
                            vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage) {
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    ((vector<int,std::allocator<int>> *)&vStack_280,
                                     (iterator)
                                     vStack_280.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,&iStack_288);
                        }
                        else {
LAB_00829804:
                          *vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish = iVar16;
                          vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish =
                               vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + 1;
                        }
                      }
                    }
LAB_00829820:
                    uVar14 = auStack_250._8_8_;
                    auStack_250._16_8_ =
                         (long)((pointer)(auStack_250._16_8_ + -0x18))->m_data + 0x17;
                    std::__detail::_List_node_base::_M_unhook();
                    operator_delete((void *)uVar14,0x18);
                    goto LAB_0082983f;
                  }
                  pCStack_1e8 = (pointer)(long)iVar16;
                  uVar19 = (long)pCStack_1e8 << 4;
                  pCStack_1b0 = (pointer)0x0;
                  lVar30 = 0;
                  iVar17 = 0;
                  auStack_250._28_4_ = 0;
                  do {
                    pVar38 = GetTriangleEdgeIndexes
                                       (pCVar28,(((ChTriangleMeshConnected *)this_05)->
                                                m_face_v_indices).
                                                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                                (long)pCStack_1e8,(int)lVar30,true);
                    iVar18 = pVar38.first;
                    if (extraout_RDX == (ChTriangleMeshConnected *)0x0) {
                      lVar25 = (long)pVar38 >> 0x20;
                      pCVar7 = (((ChTriangleMeshConnected *)this_05)->m_vertices).
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      dVar42 = pCVar7[iVar18].m_data[1] - pCVar7[lVar25].m_data[1];
                      auVar44._8_8_ = 0;
                      auVar44._0_8_ = dVar42 * dVar42;
                      auVar48._8_8_ = 0;
                      auVar48._0_8_ = pCVar7[iVar18].m_data[0] - pCVar7[lVar25].m_data[0];
                      auVar43 = vfmadd231sd_fma(auVar44,auVar48,auVar48);
                      auVar46._8_8_ = 0;
                      auVar46._0_8_ = pCVar7[iVar18].m_data[2] - pCVar7[lVar25].m_data[2];
                      auVar43 = vfmadd231sd_fma(auVar43,auVar46,auVar46);
                      if (auVar43._0_8_ < 0.0) {
                        pCVar24 = (pointer)sqrt(auVar43._0_8_);
                      }
                      else {
                        auVar43 = vsqrtsd_avx(auVar43,auVar43);
                        pCVar24 = auVar43._0_8_;
                      }
                    }
                    else {
                      pCVar28 = extraout_RDX;
                      pCVar24 = (pointer)(*(code *)((_List_node_base *)
                                                   (extraout_RDX->super_ChTriangleMesh).
                                                   super_ChGeometry._vptr_ChGeometry)[1]._M_next)
                                                   (extraout_RDX,(ulong)pVar38 & 0xffffffff,
                                                    (ulong)pVar38 >> 0x20,this_05);
                    }
                    pCVar29 = pCStack_1b8;
                    if ((double)pCStack_1b0 < (double)pCVar24) {
                      iVar17 = *(int *)((long)(vStack_200.
                                               super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->_M_elems
                                       + lVar30 * 4 + (uVar19 | 4));
                      auStack_250._28_4_ = (int)lVar30;
                      pCStack_1b0 = pCVar24;
                    }
                    lVar30 = lVar30 + 1;
                  } while (lVar30 != 3);
                  if (iVar17 == (int)pCStack_1b8) {
                    if ((double)pCStack_208 < dStack_258) {
                      SplitEdge((ChTriangleMeshConnected *)this_05,(int)pCStack_1b8,iVar16,
                                iStack_264,auStack_250._28_4_,&iStack_284,&iStack_288,&iStack_25c,
                                &iStack_260,&vStack_200,pvStack_1c8,pvStack_1c0,
                                (vector<std::vector<bool,_std::allocator<bool>_>_*,_std::allocator<std::vector<bool,_std::allocator<bool>_>_*>_>
                                 *)CONCAT44(local_13c,local_140),
                                (vector<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*,_std::allocator<std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_*>_>
                                 *)local_138.m_data[0]);
                      if (pCVar29 < (pointer)((ulong)vStack_230.
                                                     super__Bvector_base<std::allocator<bool>_>.
                                                     _M_impl.super__Bvector_impl_data._M_finish.
                                                     super__Bit_iterator_base._M_offset +
                                             ((long)vStack_230.
                                                    super__Bvector_base<std::allocator<bool>_>.
                                                    _M_impl.super__Bvector_impl_data._M_finish.
                                                    super__Bit_iterator_base._M_p -
                                             (long)vStack_230.
                                                   super__Bvector_base<std::allocator<bool>_>.
                                                   _M_impl.super__Bvector_impl_data._M_start.
                                                   super__Bit_iterator_base._M_p) * 8)) {
                        pCVar24 = (pointer)((long)pCVar29[5].m_data + 3);
                        if (-1 < (long)pCVar29) {
                          pCVar24 = pCVar29;
                        }
                        if (((ulong)((double *)
                                    vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                                    [((long)pCVar24 >> 6) +
                                     ((ulong)(((ulong)pCVar29 & 0x800000000000003f) <
                                             0x8000000000000001) - 1)] >> ((ulong)pCVar29 & 0x3f) &
                            1) != 0) {
                          if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&vStack_280,
                                       (iterator)
                                       vStack_280.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&iStack_284);
                          }
                          else {
                            *vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish = iStack_284;
                            vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + 1;
                          }
                          if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&vStack_280,
                                       (iterator)
                                       vStack_280.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&iStack_288);
                          }
                          else {
                            *vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish = iStack_288;
                            vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + 1;
                          }
                        }
                      }
                      if (pCStack_1e8 <
                          (pointer)((ulong)vStack_230.super__Bvector_base<std::allocator<bool>_>.
                                           _M_impl.super__Bvector_impl_data._M_finish.
                                           super__Bit_iterator_base._M_offset +
                                   ((long)vStack_230.super__Bvector_base<std::allocator<bool>_>.
                                          _M_impl.super__Bvector_impl_data._M_finish.
                                          super__Bit_iterator_base._M_p -
                                   (long)vStack_230.super__Bvector_base<std::allocator<bool>_>.
                                         _M_impl.super__Bvector_impl_data._M_start.
                                         super__Bit_iterator_base._M_p) * 8)) {
                        pCVar24 = (pointer)((long)pCStack_1e8[5].m_data + 3);
                        if (-1 < (long)pCStack_1e8) {
                          pCVar24 = pCStack_1e8;
                        }
                        if (((ulong)((double *)
                                    vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
                                    [((long)pCVar24 >> 6) +
                                     ((ulong)(((ulong)pCStack_1e8 & 0x800000000000003f) <
                                             0x8000000000000001) - 1)] >>
                             ((ulong)pCStack_1e8 & 0x3f) & 1) != 0) {
                          if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish ==
                              vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)&vStack_280,
                                       (iterator)
                                       vStack_280.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish,&iStack_25c);
                          }
                          else {
                            *vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish = iStack_25c;
                            vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish =
                                 vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish + 1;
                          }
                          iVar16 = iStack_260;
                          if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish !=
                              vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) goto LAB_00829804;
                          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                    ((vector<int,std::allocator<int>> *)&vStack_280,
                                     (iterator)
                                     vStack_280.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish,&iStack_260);
                        }
                      }
                    }
                    goto LAB_00829820;
                  }
                }
              } while (((double)pCStack_208 <= dStack_258) &&
                      ((ChTriangleMeshConnected *)auStack_250._0_8_ !=
                       (ChTriangleMeshConnected *)auStack_250));
            }
            CVar13._vptr_ChGeometry = (_func_int **)auStack_250._0_8_;
            while ((ChTriangleMeshConnected *)CVar13._vptr_ChGeometry !=
                   (ChTriangleMeshConnected *)auStack_250) {
              pCVar28 = (ChTriangleMeshConnected *)*CVar13._vptr_ChGeometry;
              operator_delete(CVar13._vptr_ChGeometry,0x18);
              CVar13._vptr_ChGeometry = (_func_int **)pCVar28;
            }
            plVar23 = *(list<int,std::allocator<int>> **)plStack_1a0;
          } while (*(list<int,std::allocator<int>> **)plStack_1a0 !=
                   (list<int,std::allocator<int>> *)aplStack_1e0);
        }
        pvVar26 = std::vector<int,_std::allocator<int>_>::operator=
                            ((vector<int,_std::allocator<int>_> *)pCStack_1a8,&vStack_280);
        uVar15 = SUB81(pvVar26,0);
        if (vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start != (pointer)0x0) {
          operator_delete(vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_280.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
          uVar15 = extraout_AL;
        }
        if ((pointer)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (pointer)0x0
           ) {
          operator_delete(vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          uVar15 = 0;
          vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_offset = 0;
          vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset = 0;
          vStack_230.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage = (_Bit_pointer)0x0;
        }
        if ((pointer)vStack_200.
                     super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(vStack_200.
                          super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)vStack_200.
                                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)vStack_200.
                                super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          uVar15 = extraout_AL_00;
        }
        while (aplStack_1e0[0] != (list<int,std::allocator<int>> *)aplStack_1e0) {
          plVar23 = *(list<int,std::allocator<int>> **)aplStack_1e0[0];
          operator_delete(aplStack_1e0[0],0x18);
          uVar15 = extraout_AL_01;
          aplStack_1e0[0] = plVar23;
        }
        return (bool)uVar15;
      }
      uVar27 = *(uint *)(lVar30 + (long)__n * 4);
      pCVar28 = (ChTriangleMeshConnected *)(ulong)uVar27;
      uVar32 = *(uint *)(lVar30 + (long)this_06 * 4);
      if ((int)uVar32 < (int)uVar27) {
        uVar32 = uVar27;
      }
      local_138.m_data[0] = (double)CONCAT44(local_138.m_data[0]._4_4_,uVar32);
      if (__position_00._M_current == *(int **)(this_02 + 0x10)) {
        pStack_150.first = 0x82906e;
        pStack_150.second = 0;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_02,__position_00,(int *)__args);
      }
      else {
        *__position_00._M_current = uVar32;
        *(int **)(this_02 + 8) = __position_00._M_current + 1;
      }
      pVar38 = (pair<int,_int>)((long)pVar38 + 8);
    } while (pVar38 != pVar40);
  }
  puVar8 = *(undefined8 **)(aux_data_bool + 8);
  for (puVar39 = *(undefined8 **)aux_data_bool; puVar39 != puVar8; puVar39 = puVar39 + 1) {
    this_03 = (vector<bool,_std::allocator<bool>_> *)*puVar39;
    pStack_150.first = 0x82909a;
    pStack_150.second = 0;
    rVar49 = std::vector<bool,_std::allocator<bool>_>::at(this_03,(size_type)__n);
    __x = true;
    if ((*rVar49._M_p & rVar49._M_mask) == 0) {
      pStack_150.first = 0x8290ac;
      pStack_150.second = 0;
      rVar49 = std::vector<bool,_std::allocator<bool>_>::at(this_03,(size_type)this_06);
      __x = (*rVar49._M_p & rVar49._M_mask) != 0;
    }
    pStack_150.first = 0x8290bd;
    pStack_150.second = 0;
    std::vector<bool,_std::allocator<bool>_>::push_back(this_03,__x);
  }
  return true;
}

Assistant:

bool ChTriangleMeshConnected::SplitEdge(
    int itA,                                              // triangle index,
    int itB,                                              // triangle index, -1 if not existing (means free edge on A)
    int neA,                                              // n.edge on tri A: 0,1,2
    int neB,                                              // n.edge on tri B: 0,1,2
    int& itA_1,                                           // returns the index of split triangle A, part1
    int& itA_2,                                           // returns the index of split triangle A, part2
    int& itB_1,                                           // returns the index of split triangle B, part1
    int& itB_2,                                           // returns the index of split triangle B, part2
    std::vector<std::array<int, 4>>& tri_map,             // triangle neighboring map
    std::vector<std::vector<double>*>& aux_data_double,   // auxiliary buffers to interpolate
    std::vector<std::vector<int>*>& aux_data_int,         // auxiliary buffers to interpolate
    std::vector<std::vector<bool>*>& aux_data_bool,       // auxiliary buffers to interpolate
    std::vector<std::vector<ChVector<>>*>& aux_data_vect  // auxiliary buffers to interpolate
) {
    std::array<std::vector<ChVector<int>>*, 4> face_indexes{
        &m_face_v_indices,   //
        &m_face_n_indices,   //
        &m_face_uv_indices,  //
        &m_face_col_indices  //
    };

    int iea = 0;
    int ieb = 0;

    for (int ibuffer = 0; ibuffer < 4; ++ibuffer) {
        if (face_indexes[ibuffer]->size()) {
            // case where one used normals, uv, color buffers, with custom face indexes:
            std::pair<int, int> eA;
            eA = ChTriangleMeshConnected::GetTriangleEdgeIndexes(face_indexes[ibuffer]->at(itA), neA, false);
            std::pair<int, int> eAB = eA;
            std::pair<int, int> eB;
            if (itB != -1)
                eB = ChTriangleMeshConnected::GetTriangleEdgeIndexes(face_indexes[ibuffer]->at(itB), neB, false);
            bool swapA = false;
            if (eA.first > eA.second) {
                swapA = true;
                eAB = {eA.second, eA.first};
            }
            bool swapB = false;
            if (eB.first > eB.second)
                swapB = true;

            // average new vertex/property and add it
            int iVnew = -1;
            InterpolateAndInsert(*this, ibuffer, eAB.first, eAB.second, iVnew);

            if (ibuffer == 0) {
                iea = eAB.first;
                ieb = eAB.second;
            }

            itA_1 = -1;
            itA_2 = -1;
            itB_1 = -1;
            itB_2 = -1;

            // Split triangle A in two (reuse existing, and allocate one new)
            ChVector<int> tA_1 = face_indexes[ibuffer]->at(itA);
            if (tA_1.x() == eAB.first)
                tA_1.x() = iVnew;
            if (tA_1.y() == eAB.first)
                tA_1.y() = iVnew;
            if (tA_1.z() == eAB.first)
                tA_1.z() = iVnew;
            ChVector<int> tA_2 = face_indexes[ibuffer]->at(itA);
            if (tA_2.x() == eAB.second)
                tA_2.x() = iVnew;
            if (tA_2.y() == eAB.second)
                tA_2.y() = iVnew;
            if (tA_2.z() == eAB.second)
                tA_2.z() = iVnew;
            face_indexes[ibuffer]->at(itA) = tA_1;  // reuse face
            itA_1 = itA;
            face_indexes[ibuffer]->push_back(tA_2);  // allocate new face
            itA_2 = (int)face_indexes[ibuffer]->size() - 1;

            // Split triangle B in two (reuse existing, and allocate one new)
            if (itB != -1) {
                ChVector<int> tB_1 = face_indexes[ibuffer]->at(itB);
                if (tB_1.x() == eAB.first)
                    tB_1.x() = iVnew;
                if (tB_1.y() == eAB.first)
                    tB_1.y() = iVnew;
                if (tB_1.z() == eAB.first)
                    tB_1.z() = iVnew;
                ChVector<int> tB_2 = face_indexes[ibuffer]->at(itB);
                if (tB_2.x() == eAB.second)
                    tB_2.x() = iVnew;
                if (tB_2.y() == eAB.second)
                    tB_2.y() = iVnew;
                if (tB_2.z() == eAB.second)
                    tB_2.z() = iVnew;
                face_indexes[ibuffer]->at(itB) = tB_1;  // reuse face
                itB_1 = itB;
                face_indexes[ibuffer]->push_back(tB_2);  // allocate new face
                itB_2 = (int)face_indexes[ibuffer]->size() - 1;
            }

            // for m_face_v_indices buffer (vertex indexes) only:
            if (ibuffer == 0) {
                // Update triangle neighboring map

                std::array<int, 4> topo_A_1 = tri_map[itA];
                std::array<int, 4> topo_A_2 = tri_map[itA];
                topo_A_1[1 + neA] = itB_1;
                topo_A_2[1 + neA] = itB_2;
                int is1 = 1 + ((neA + 2) % 3);
                int is2 = 1 + ((neA + 1) % 3);
                if (swapA)
                    std::swap(is1, is2);
                topo_A_1[is1] = itA_2;
                topo_A_2[is2] = itA_1;
                int itD = topo_A_1[is2];
                int itC = topo_A_2[is1];
                for (int in = 1; in < 4; ++in)
                    if (tri_map[itD][in] == itA)
                        tri_map[itD][in] = itA_1;  // not needed?
                for (int in = 1; in < 4; ++in)
                    if (tri_map[itC][in] == itA)
                        tri_map[itC][in] = itA_2;
                tri_map[itA] = topo_A_1;      // reuse
                tri_map.push_back(topo_A_2);  // allocate
                topo_A_2[0] = (int)tri_map.size() - 1;

                if (itB != -1) {
                    std::array<int, 4> topo_B_1 = tri_map[itB];
                    std::array<int, 4> topo_B_2 = tri_map[itB];
                    topo_B_1[1 + neB] = itA_1;
                    topo_B_2[1 + neB] = itA_2;
                    is1 = 1 + ((neB + 2) % 3);
                    is2 = 1 + ((neB + 1) % 3);
                    if (swapB)
                        std::swap(is1, is2);
                    topo_B_1[is1] = itB_2;
                    topo_B_2[is2] = itB_1;
                    int itF = topo_B_1[is2];
                    int itE = topo_B_2[is1];
                    for (int in = 1; in < 4; ++in)
                        if (tri_map[itF][in] == itB)
                            tri_map[itF][in] = itB_1;  // not needed?
                    for (int in = 1; in < 4; ++in)
                        if (tri_map[itE][in] == itB)
                            tri_map[itE][in] = itB_2;
                    tri_map[itB] = topo_B_1;      // reuse
                    tri_map.push_back(topo_B_2);  // allocate
                    topo_B_2[0] = (int)tri_map.size() - 1;
                }
            }
        } else {
            // case of n or uv or color buffers without indexes, because assumed matching the vertex pos buffer:
            int iVnew = -1;
            InterpolateAndInsert(*this, ibuffer, iea, ieb, iVnew);
        }

    }  // end loop on buffers

    // just in case the user populated the vector of external auxiliary data buffers,
    // interpolate and store the created value. Assume those have same size of m_vertices
    for (auto data_buffer : aux_data_double) {
        double data = (data_buffer->at(iea) + data_buffer->at(ieb)) * 0.5;
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_vect) {
        ChVector<> data = (data_buffer->at(iea) + data_buffer->at(ieb)) * 0.5;
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_int) {
        int data = std::max(data_buffer->at(iea), data_buffer->at(ieb));
        data_buffer->push_back(data);
    }
    for (auto data_buffer : aux_data_bool) {
        bool data = data_buffer->at(iea) || data_buffer->at(ieb);
        data_buffer->push_back(data);
    }

    return true;
}